

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# override.cc
# Opt level: O0

void __thiscall Override::printRaw(Override *this,ostream *s,Architecture *glb)

{
  FuncProto *this_00;
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  AddrSpace *this_01;
  ostream *poVar4;
  string *psVar5;
  void *pvVar6;
  reference ppVar7;
  reference ppVar8;
  allocator local_91;
  string local_90 [32];
  _Self local_70;
  _Base_ptr local_68;
  _Rb_tree_const_iterator<std::pair<const_Address,_FuncProto_*>_> local_60;
  const_iterator fiter;
  AddrSpace *spc;
  const_iterator cStack_38;
  int4 i;
  _Base_ptr local_30;
  _Rb_tree_const_iterator<std::pair<const_Address,_Address>_> local_28;
  const_iterator iter;
  Architecture *glb_local;
  ostream *s_local;
  Override *this_local;
  
  iter._M_node = (_Base_ptr)glb;
  std::_Rb_tree_const_iterator<std::pair<const_Address,_Address>_>::_Rb_tree_const_iterator
            (&local_28);
  local_30 = (_Base_ptr)
             std::
             map<Address,_Address,_std::less<Address>,_std::allocator<std::pair<const_Address,_Address>_>_>
             ::begin(&this->forcegoto);
  local_28._M_node = local_30;
  while( true ) {
    cStack_38 = std::
                map<Address,_Address,_std::less<Address>,_std::allocator<std::pair<const_Address,_Address>_>_>
                ::end(&this->forcegoto);
    bVar1 = std::operator!=(&local_28,&stack0xffffffffffffffc8);
    if (!bVar1) break;
    poVar4 = std::operator<<(s,"force goto at ");
    ppVar7 = std::_Rb_tree_const_iterator<std::pair<const_Address,_Address>_>::operator*(&local_28);
    poVar4 = ::operator<<(poVar4,&ppVar7->first);
    poVar4 = std::operator<<(poVar4," jumping to ");
    ppVar7 = std::_Rb_tree_const_iterator<std::pair<const_Address,_Address>_>::operator*(&local_28);
    poVar4 = ::operator<<(poVar4,&ppVar7->second);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::_Rb_tree_const_iterator<std::pair<const_Address,_Address>_>::operator++(&local_28);
  }
  for (spc._4_4_ = 0; sVar2 = std::vector<int,_std::allocator<int>_>::size(&this->deadcodedelay),
      (ulong)(long)spc._4_4_ < sVar2; spc._4_4_ = spc._4_4_ + 1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&this->deadcodedelay,(long)spc._4_4_);
    if (-1 < *pvVar3) {
      this_01 = AddrSpaceManager::getSpace((AddrSpaceManager *)iter._M_node,spc._4_4_);
      poVar4 = std::operator<<(s,"dead code delay on ");
      psVar5 = AddrSpace::getName_abi_cxx11_(this_01);
      poVar4 = std::operator<<(poVar4,(string *)psVar5);
      poVar4 = std::operator<<(poVar4," set to ");
      pvVar6 = (void *)std::ostream::operator<<(poVar4,std::dec);
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&this->deadcodedelay,(long)spc._4_4_);
      pvVar6 = (void *)std::ostream::operator<<(pvVar6,*pvVar3);
      std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    }
  }
  local_28._M_node =
       (_Base_ptr)
       std::
       map<Address,_Address,_std::less<Address>,_std::allocator<std::pair<const_Address,_Address>_>_>
       ::begin(&this->forcegoto);
  while( true ) {
    fiter._M_node =
         (_Base_ptr)
         std::
         map<Address,_Address,_std::less<Address>,_std::allocator<std::pair<const_Address,_Address>_>_>
         ::end(&this->forcegoto);
    bVar1 = std::operator!=(&local_28,(_Self *)&fiter);
    if (!bVar1) break;
    poVar4 = std::operator<<(s,"override indirect at ");
    ppVar7 = std::_Rb_tree_const_iterator<std::pair<const_Address,_Address>_>::operator*(&local_28);
    poVar4 = ::operator<<(poVar4,&ppVar7->first);
    poVar4 = std::operator<<(poVar4," to call directly to ");
    ppVar7 = std::_Rb_tree_const_iterator<std::pair<const_Address,_Address>_>::operator*(&local_28);
    poVar4 = ::operator<<(poVar4,&ppVar7->second);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::_Rb_tree_const_iterator<std::pair<const_Address,_Address>_>::operator++(&local_28);
  }
  std::_Rb_tree_const_iterator<std::pair<const_Address,_FuncProto_*>_>::_Rb_tree_const_iterator
            (&local_60);
  local_68 = (_Base_ptr)
             std::
             map<Address,_FuncProto_*,_std::less<Address>,_std::allocator<std::pair<const_Address,_FuncProto_*>_>_>
             ::begin(&this->protoover);
  local_60._M_node = local_68;
  while( true ) {
    local_70._M_node =
         (_Base_ptr)
         std::
         map<Address,_FuncProto_*,_std::less<Address>,_std::allocator<std::pair<const_Address,_FuncProto_*>_>_>
         ::end(&this->protoover);
    bVar1 = std::operator!=(&local_60,&local_70);
    if (!bVar1) break;
    poVar4 = std::operator<<(s,"override prototype at ");
    ppVar8 = std::_Rb_tree_const_iterator<std::pair<const_Address,_FuncProto_*>_>::operator*
                       (&local_60);
    poVar4 = ::operator<<(poVar4,&ppVar8->first);
    std::operator<<(poVar4," to ");
    ppVar8 = std::_Rb_tree_const_iterator<std::pair<const_Address,_FuncProto_*>_>::operator*
                       (&local_60);
    this_00 = ppVar8->second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,"func",&local_91);
    FuncProto::printRaw(this_00,(string *)local_90,s);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    std::ostream::operator<<(s,std::endl<char,std::char_traits<char>>);
    std::_Rb_tree_const_iterator<std::pair<const_Address,_FuncProto_*>_>::operator++(&local_60);
  }
  return;
}

Assistant:

void Override::printRaw(ostream &s,Architecture *glb) const

{
  map<Address,Address>::const_iterator iter;

  for(iter=forcegoto.begin();iter!=forcegoto.end();++iter)
    s << "force goto at " << (*iter).first << " jumping to " << (*iter).second << endl;

  for(int4 i=0;i<deadcodedelay.size();++i) {
    if (deadcodedelay[i] < 0) continue;
    AddrSpace *spc = glb->getSpace(i);
    s << "dead code delay on " << spc->getName() << " set to " << dec << deadcodedelay[i] << endl;
  }

  for(iter=forcegoto.begin();iter!=forcegoto.end();++iter)
    s << "override indirect at " << (*iter).first << " to call directly to " << (*iter).second << endl;

  map<Address,FuncProto *>::const_iterator fiter;

  for(fiter=protoover.begin();fiter!=protoover.end();++fiter) {
    s << "override prototype at " << (*fiter).first << " to ";
    (*fiter).second->printRaw("func",s);
    s << endl;
  }
}